

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

bool __thiscall CS248::Shader::prepareSourceCode(Shader *this,string *filename,string *out_source)

{
  long lVar1;
  char cVar2;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string version;
  undefined1 auStack_288 [15];
  char local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  byte abStack_218 [488];
  
  std::__cxx11::string::_M_replace
            ((ulong)out_source,0,(char *)out_source->_M_string_length,0x1c2cca);
  std::ifstream::ifstream(&local_238);
  std::ifstream::open((char *)&local_238,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  local_279 = std::__basic_file<char>::is_open();
  if (local_279 == '\0') {
    std::ifstream::~ifstream(&local_238);
  }
  else {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    lVar1 = *(long *)(local_238._M_dataplus._M_p + -0x18);
    if ((abStack_218[lVar1] & 2) == 0) {
      do {
        cVar2 = std::ios::widen((char)auStack_288 + (char)lVar1 + 'P');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_238,(string *)&local_278,cVar2);
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        std::__cxx11::string::append((char *)local_258);
        std::__cxx11::string::_M_append((char *)out_source,(ulong)local_258[0]);
        if (local_258[0] != local_248) {
          operator_delete(local_258[0]);
        }
        lVar1 = *(long *)(local_238._M_dataplus._M_p + -0x18);
      } while ((abStack_218[lVar1] & 2) == 0);
    }
    std::ifstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(&local_238);
    if (local_279 != '\0') {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"#version 130\n","");
      std::operator+(&local_278,&local_238,out_source);
      std::__cxx11::string::operator=((string *)out_source,(string *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
    }
  }
  return (bool)local_279;
}

Assistant:

bool Shader::prepareSourceCode(const std::string& filename, std::string* out_source) {
  if (!readFile(filename, *out_source)) {
    return false;
  }
#ifdef __APPLE__
  std::string version = "#version 150\n";
#else
  std::string version = "#version 130\n";
#endif 
  *out_source  = version + (*out_source);
  return true;
}